

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O1

string * iutest::detail::ToHexString<char>(string *__return_storage_ptr__,char *str,int length)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  uint uVar6;
  char cVar7;
  int iVar8;
  char local_5c [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (length != 0) {
    iVar8 = 0;
    do {
      cVar1 = *str;
      if (cVar1 == '\0') {
        return __return_storage_ptr__;
      }
      local_5c[0] = '\0';
      local_5c[1] = '\0';
      lVar4 = 4;
      pcVar5 = local_5c;
      do {
        uVar6 = (int)cVar1 >> ((byte)lVar4 & 0x1f) & 0xf;
        cVar2 = (char)uVar6;
        cVar7 = cVar2 + '0';
        if (9 < uVar6) {
          cVar7 = cVar2 + '7';
        }
        *pcVar5 = cVar7;
        pcVar5 = pcVar5 + 1;
        lVar4 = lVar4 + -4;
      } while (lVar4 == 0);
      local_5c[2] = 0;
      local_50[0] = local_40;
      sVar3 = strlen(local_5c);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,local_5c,local_5c + sVar3);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      str = str + 1;
      iVar8 = iVar8 + 1;
    } while (iVar8 < length || length < 0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string ToHexString(const T* str, int length)
{
    ::std::string r;
    for( int i=0; (length < 0 || i < length) && *str != 0; ++str, ++i)
    {
        r += ToHexString(*str);
    }
    return r;
}